

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# having_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::HavingBinder::BindColumnRef
          (BindResult *__return_storage_ptr__,HavingBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  BoundSelectNode *pBVar3;
  pointer puVar4;
  idx_t iVar5;
  pointer puVar6;
  undefined8 uVar7;
  bool bVar8;
  BaseExpression *pBVar9;
  ColumnRefExpression *pCVar10;
  string *psVar11;
  LambdaRefExpression *expr_00;
  pointer pEVar12;
  BoundColumnRefExpression *this_00;
  BinderException *pBVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  pointer *__ptr;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  _Var14;
  undefined7 in_register_00000081;
  ColumnBinding binding;
  BindResult expr;
  ColumnRefExpression col_ref;
  LogicalType return_type;
  BindResult alias_result;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_268;
  undefined4 local_25c;
  _func_int **local_258;
  string *local_250;
  _func_int **local_248;
  undefined1 local_240 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1f0 [56];
  undefined1 local_1b8 [16];
  _Alloc_hider local_1a8;
  char local_198 [16];
  optional_idx local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180 [24];
  LogicalType local_168;
  LogicalType local_150;
  undefined1 local_138 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e8 [56];
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_25c = (undefined4)CONCAT71(in_register_00000081,root_expression);
  pBVar9 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->(expr_ptr)->super_BaseExpression;
  pCVar10 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar9);
  local_258 = (_func_int **)&PTR__BaseExpression_0247eec0;
  local_1b8._0_8_ = &PTR__BaseExpression_0247eec0;
  local_1b8[8] = (pCVar10->super_ParsedExpression).super_BaseExpression.type;
  local_1b8[9] = (pCVar10->super_ParsedExpression).super_BaseExpression.expression_class;
  local_1a8._M_p = local_198;
  pcVar2 = (pCVar10->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar2,
             pcVar2 + (pCVar10->super_ParsedExpression).super_BaseExpression.alias._M_string_length)
  ;
  local_188.index = (pCVar10->super_ParsedExpression).super_BaseExpression.query_location.index;
  local_248 = (_func_int **)&PTR__ColumnRefExpression_0247ca78;
  local_1b8._0_8_ = &PTR__ColumnRefExpression_0247ca78;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_180,
           &(pCVar10->column_names).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  psVar11 = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)local_1b8);
  bVar8 = ColumnRefExpression::IsQualified((ColumnRefExpression *)local_1b8);
  if (bVar8) {
LAB_00e11d26:
    BindResult::BindResult((BindResult *)local_138);
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)depth;
    bVar8 = ColumnAliasBinder::BindAlias
                      (&this->column_alias_binder,(ExpressionBinder *)this,expr_ptr,depth,
                       local_25c._0_1_,(BindResult *)local_138);
    if (bVar8) {
      if (depth != 0) {
        pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
        local_240._0_8_ = (long)local_240 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_240,
                   "Having clause cannot reference alias \"%s\" in correlated subquery","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = (psVar11->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + psVar11->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar13,(string *)local_240,&local_50);
        __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      (__return_storage_ptr__->expression).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false> =
           (_Head_base<0UL,_duckdb::Expression_*,_false>)local_138._0_8_;
      local_138._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      (__return_storage_ptr__->error).initialized = (bool)local_138[8];
      (__return_storage_ptr__->error).type = local_138[9];
      paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
      (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._16_8_ == &local_118) {
        *(undefined4 *)paVar1 = local_118._M_allocated_capacity._0_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
             local_118._M_allocated_capacity._4_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
             local_118._8_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
             local_118._12_4_;
      }
      else {
        (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_138._16_8_;
        (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
             CONCAT44(local_118._M_allocated_capacity._4_4_,local_118._M_allocated_capacity._0_4_);
      }
      (__return_storage_ptr__->error).raw_message._M_string_length = local_138._24_8_;
      local_138._24_8_ = 0;
      local_118._M_allocated_capacity._0_4_ = local_118._M_allocated_capacity._0_4_ & 0xffffff00;
      paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
      (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p == &local_f8) {
        *(undefined4 *)paVar1 = local_f8._M_allocated_capacity._0_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
             local_f8._M_allocated_capacity._4_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
             local_f8._8_4_;
        *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
             local_f8._12_4_;
      }
      else {
        (__return_storage_ptr__->error).final_message._M_dataplus._M_p = local_108._M_p;
        (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
             CONCAT44(local_f8._M_allocated_capacity._4_4_,local_f8._M_allocated_capacity._0_4_);
      }
      (__return_storage_ptr__->error).final_message._M_string_length = local_100;
      local_100 = 0;
      local_f8._M_allocated_capacity._0_4_ = local_f8._M_allocated_capacity._0_4_ & 0xffffff00;
      local_138._16_8_ = &local_118;
      local_108._M_p = (pointer)&local_f8;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(__return_storage_ptr__->error).extra_info,local_e8);
    }
    else if (this->aggregate_handling == FORCE_AGGREGATES) {
      if (depth != 0) {
        pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
        local_240._0_8_ = (long)local_240 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_240,
                   "Having clause cannot reference column \"%s\" in correlated subquery and group by all"
                   ,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar2 = (psVar11->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + psVar11->_M_string_length);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar13,(string *)local_240,&local_70);
        __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ExpressionBinder::BindExpression
                ((BindResult *)local_240,(ExpressionBinder *)this,expr_ptr,0,false);
      if ((bool)local_240[8] == true) {
        (__return_storage_ptr__->expression).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false> =
             (_Head_base<0UL,_duckdb::Expression_*,_false>)local_240._0_8_;
        local_240._0_8_ =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
        (__return_storage_ptr__->error).initialized = (bool)local_240[8];
        (__return_storage_ptr__->error).type = local_240[9];
        paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
        (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._16_8_ == &local_220) {
          *(undefined4 *)paVar1 = local_220._M_allocated_capacity._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
               local_220._M_allocated_capacity._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
               local_220._8_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
               local_220._12_4_;
        }
        else {
          (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_240._16_8_;
          (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
               CONCAT44(local_220._M_allocated_capacity._4_4_,local_220._M_allocated_capacity._0_4_)
          ;
        }
        (__return_storage_ptr__->error).raw_message._M_string_length = local_240._24_8_;
        local_240._24_8_ = 0;
        local_220._M_allocated_capacity._0_4_ = local_220._M_allocated_capacity._0_4_ & 0xffffff00;
        paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
        (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_p == &local_200) {
          *(undefined4 *)paVar1 = local_200._M_allocated_capacity._0_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
               local_200._M_allocated_capacity._4_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
               local_200._8_4_;
          *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
               local_200._12_4_;
        }
        else {
          (__return_storage_ptr__->error).final_message._M_dataplus._M_p = local_210._M_p;
          (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
               CONCAT44(local_200._M_allocated_capacity._4_4_,local_200._M_allocated_capacity._0_4_)
          ;
        }
        (__return_storage_ptr__->error).final_message._M_string_length = local_208;
        local_208 = 0;
        local_200._M_allocated_capacity._0_4_ = local_200._M_allocated_capacity._0_4_ & 0xffffff00;
        local_240._16_8_ = &local_220;
        local_210._M_p = (pointer)&local_200;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(__return_storage_ptr__->error).extra_info,local_1f0);
      }
      else {
        pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_240);
        LogicalType::LogicalType(&local_168,&pEVar12->return_type);
        pBVar3 = (this->super_BaseSelectBinder).node;
        puVar4 = (pBVar3->groups).group_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        iVar5 = pBVar3->group_index;
        puVar6 = (pBVar3->groups).group_expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType(&local_150,&local_168);
        binding.column_index = (long)puVar4 - (long)puVar6 >> 3;
        binding.table_index = iVar5;
        BoundColumnRefExpression::BoundColumnRefExpression(this_00,&local_150,binding,0);
        LogicalType::~LogicalType(&local_150);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&((this->super_BaseSelectBinder).node)->groups,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   local_240);
        local_268._M_head_impl = (Expression *)this_00;
        BindResult::BindResult
                  (__return_storage_ptr__,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_268);
        if ((BoundColumnRefExpression *)local_268._M_head_impl != (BoundColumnRefExpression *)0x0) {
          (*(((Expression *)&(local_268._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        local_268._M_head_impl = (Expression *)0x0;
        LogicalType::~LogicalType(&local_168);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_p != &local_200) {
        operator_delete(local_210._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._16_8_ != &local_220) {
        operator_delete((void *)local_240._16_8_);
      }
      if ((ParsedExpression *)local_240._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_240._0_8_ + 8))();
      }
    }
    else {
      local_90[0] = local_80;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "column %s must appear in the GROUP BY clause or be used in an aggregate function",
                 "");
      pcVar2 = (psVar11->_M_dataplus)._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,pcVar2 + psVar11->_M_string_length);
      StringUtil::Format<std::__cxx11::string>
                ((string *)local_240,(StringUtil *)local_90,&local_b0,params);
      BindResult::BindResult(__return_storage_ptr__,(string *)local_240);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p != &local_f8) {
      operator_delete(local_108._M_p);
    }
    _Var14.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)
         (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_138._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._16_8_ != &local_118) {
      operator_delete((void *)local_138._16_8_);
      _Var14.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)
           (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_138._0_8_;
    }
  }
  else {
    ColumnRefExpression::GetName_abi_cxx11_((string *)local_138,(ColumnRefExpression *)local_1b8);
    LambdaRefExpression::FindMatchingBinding
              ((LambdaRefExpression *)local_240,
               &(this->super_BaseSelectBinder).super_ExpressionBinder.lambda_bindings,
               (string *)local_138);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_);
    }
    if ((Expression *)local_240._0_8_ == (Expression *)0x0) {
      local_250 = psVar11;
      psVar11 = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)local_1b8);
      (*(this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[6])
                (local_138,this,psVar11);
      uVar7 = local_138._0_8_;
      if ((Expression *)local_138._0_8_ != (Expression *)0x0) {
        (*(this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder[5])
                  (__return_storage_ptr__,this,local_138,depth,0);
      }
      if ((Expression *)local_138._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_138._0_8_ + 8))();
      }
      if ((Expression *)local_240._0_8_ != (Expression *)0x0) {
        (*((BaseExpression *)local_240._0_8_)->_vptr_BaseExpression[1])();
      }
      psVar11 = local_250;
      if ((Expression *)uVar7 != (Expression *)0x0) goto LAB_00e12236;
      goto LAB_00e11d26;
    }
    pBVar9 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                            *)local_240)->super_BaseExpression;
    expr_00 = BaseExpression::Cast<duckdb::LambdaRefExpression>(pBVar9);
    BindLambdaReference(__return_storage_ptr__,this,expr_00,depth);
    _Var14.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)
         (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_240._0_8_;
  }
  if (_Var14.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    (*(*(_func_int ***)_Var14.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)
      [1])();
  }
LAB_00e12236:
  local_1b8._0_8_ = local_248;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_180);
  local_1b8._0_8_ = local_258;
  if (local_1a8._M_p != local_198) {
    operator_delete(local_1a8._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult HavingBinder::BindColumnRef(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {

	// Keep the original column name to return a meaningful error message.
	auto col_ref = expr_ptr->Cast<ColumnRefExpression>();
	const auto &column_name = col_ref.GetColumnName();

	// Try binding as a lambda parameter
	if (!col_ref.IsQualified()) {
		auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, col_ref.GetName());
		if (lambda_ref) {
			return BindLambdaReference(lambda_ref->Cast<LambdaRefExpression>(), depth);
		}
		// column was not found - check if it is a SQL value function
		auto value_function = GetSQLValueFunction(col_ref.GetColumnName());
		if (value_function) {
			return BindExpression(value_function, depth);
		}
	}

	// Bind the alias.
	BindResult alias_result;
	auto found_alias = column_alias_binder.BindAlias(*this, expr_ptr, depth, root_expression, alias_result);
	if (found_alias) {
		if (depth > 0) {
			throw BinderException("Having clause cannot reference alias \"%s\" in correlated subquery", column_name);
		}
		return alias_result;
	}

	if (aggregate_handling != AggregateHandling::FORCE_AGGREGATES) {
		return BindResult(StringUtil::Format(
		    "column %s must appear in the GROUP BY clause or be used in an aggregate function", column_name));
	}

	if (depth > 0) {
		throw BinderException("Having clause cannot reference column \"%s\" in correlated subquery and group by all",
		                      column_name);
	}

	auto expr = duckdb::BaseSelectBinder::BindColumnRef(expr_ptr, depth, root_expression);
	if (expr.HasError()) {
		return expr;
	}

	// Return a GROUP BY column reference expression.
	auto return_type = expr.expression->return_type;
	auto column_binding = ColumnBinding(node.group_index, node.groups.group_expressions.size());
	auto group_ref = make_uniq<BoundColumnRefExpression>(return_type, column_binding);
	node.groups.group_expressions.push_back(std::move(expr.expression));
	return BindResult(std::move(group_ref));
}